

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O2

bool __thiscall duckdb::Executor::ResultCollectorIsBlocked(Executor *this)

{
  bool bVar1;
  int iVar2;
  Task *pTVar3;
  __node_base *p_Var4;
  
  bVar1 = HasStreamingResultCollector(this);
  if (bVar1) {
    bVar1 = false;
    if (((this->completed_pipelines).super___atomic_base<unsigned_long>._M_i + 1 ==
         this->total_pipelines) &&
       (bVar1 = false, (this->to_be_rescheduled_tasks)._M_h._M_element_count != 0)) {
      p_Var4 = &(this->to_be_rescheduled_tasks)._M_h._M_before_begin;
      do {
        p_Var4 = p_Var4->_M_nxt;
        bVar1 = p_Var4 != (__node_base *)0x0;
        if (p_Var4 == (__node_base *)0x0) {
          return bVar1;
        }
        pTVar3 = shared_ptr<duckdb::Task,_true>::operator->
                           ((shared_ptr<duckdb::Task,_true> *)(p_Var4 + 2));
        iVar2 = (*pTVar3->_vptr_Task[5])(pTVar3);
      } while ((char)iVar2 == '\0');
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Executor::ResultCollectorIsBlocked() {
	if (!HasStreamingResultCollector()) {
		return false;
	}
	if (completed_pipelines + 1 != total_pipelines) {
		// The result collector is always in the last pipeline
		return false;
	}
	if (to_be_rescheduled_tasks.empty()) {
		return false;
	}
	for (auto &kv : to_be_rescheduled_tasks) {
		auto &task = kv.second;
		if (task->TaskBlockedOnResult()) {
			// At least one of the blocked tasks is connected to a result collector
			// This task could be the only task that could unblock the other non-result-collector tasks
			// To prevent a scenario where we halt indefinitely, we return here so it can be unblocked by a call to
			// Fetch
			return true;
		}
	}
	return false;
}